

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void do_cmd_options(void)

{
  menu *pmVar1;
  
  if (option_menu == (menu *)0x0) {
    pmVar1 = menu_new_action(option_actions,0x14);
    option_menu = pmVar1;
    pmVar1->title = "Options Menu";
    pmVar1->flags = 8;
  }
  screen_save();
  clear_from(L'\0');
  menu_layout(option_menu,&SCREEN_REGION);
  menu_select(option_menu,0,false);
  screen_load();
  return;
}

Assistant:

void do_cmd_options(void)
{
	if (!option_menu) {
		/* Main option menu */
		option_menu = menu_new_action(option_actions,
				N_ELEMENTS(option_actions));

		option_menu->title = "Options Menu";
		option_menu->flags = MN_CASELESS_TAGS;
	}

	screen_save();
	clear_from(0);

	menu_layout(option_menu, &SCREEN_REGION);
	menu_select(option_menu, 0, false);

	screen_load();
}